

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O1

ssize_t __thiscall FileInputSource::read(FileInputSource *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  qpdf_offset_t qVar2;
  size_t sVar3;
  undefined4 extraout_var;
  QPDFExc *this_00;
  long *plVar4;
  size_type *psVar5;
  undefined4 in_register_00000034;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  qVar2 = QUtil::tell(this->file);
  (this->super_InputSource).last_offset = qVar2;
  sVar3 = fread((void *)CONCAT44(in_register_00000034,__fd),1,(size_t)__buf,(FILE *)this->file);
  if (sVar3 == 0) {
    iVar1 = ferror((FILE *)this->file);
    if (iVar1 != 0) {
      this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
      qVar2 = (this->super_InputSource).last_offset;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"read ","");
      std::__cxx11::to_string(&local_70,(unsigned_long)__buf);
      std::operator+(&local_50,&local_b0,&local_70);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_d0._M_dataplus._M_p = (pointer)*plVar4;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar5) {
        local_d0.field_2._M_allocated_capacity = *psVar5;
        local_d0.field_2._8_8_ = plVar4[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar5;
      }
      local_d0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      QPDFExc::QPDFExc(this_00,qpdf_e_system,&this->filename,&local_90,qVar2,&local_d0);
      __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    if (__buf != (void *)0x0) {
      (*(this->super_InputSource)._vptr_InputSource[5])(this,0,2);
      iVar1 = (*(this->super_InputSource)._vptr_InputSource[4])(this);
      (this->super_InputSource).last_offset = CONCAT44(extraout_var,iVar1);
    }
  }
  return sVar3;
}

Assistant:

size_t
FileInputSource::read(char* buffer, size_t length)
{
    this->last_offset = QUtil::tell(this->file);
    size_t len = fread(buffer, 1, length, this->file);
    if (len == 0) {
        if (ferror(this->file)) {
            throw QPDFExc(
                qpdf_e_system,
                this->filename,
                "",
                this->last_offset,
                (std::string("read ") + std::to_string(length) + " bytes"));
        } else if (length > 0) {
            this->seek(0, SEEK_END);
            this->last_offset = this->tell();
        }
    }
    return len;
}